

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.h
# Opt level: O0

void __thiscall Initialize::Initialize(Initialize *this)

{
  char *__s;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Initialize *local_10;
  Initialize *this_local;
  
  local_10 = this;
  Tools::getInstance();
  __s = (char *)std::__cxx11::string::data();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
  std::operator+(&this->path,&local_30,"/.stn");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  CreateFolder(this);
  CreateSubDirs(this);
  CreateFiles(this);
  return;
}

Assistant:

Initialize() {
        this->CreateFolder();
        this->CreateSubDirs();
        this->CreateFiles();
    }